

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O1

bool __thiscall
ON_SubDMeshImpl::ReserveCapacity
          (ON_SubDMeshImpl *this,uint subd_fragment_count,uint absolute_subd_display_density)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  
  ClearTree(this);
  this->m_absolute_subd_display_density = 0;
  this->m_fragment_count = 0;
  this->m_fragment_point_count = 0;
  this->m_first_fragment = (ON_SubDMeshFragment *)0x0;
  if ((absolute_subd_display_density < 7) && (subd_fragment_count != 0)) {
    iVar2 = (1 << ((byte)absolute_subd_display_density & 0x1f)) + 1;
    uVar3 = iVar2 * iVar2;
    bVar1 = ON_FixedSizePool::Create
                      (&this->m_fsp,(ulong)(uVar3 * 0x60 + 0x248),(ulong)subd_fragment_count,0);
    if (bVar1) {
      this->m_absolute_subd_display_density = absolute_subd_display_density;
      this->m_fragment_point_count = uVar3;
    }
    else {
      ON_SubDIncrementErrorCount();
    }
  }
  else {
    ON_SubDIncrementErrorCount();
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ON_SubDMeshImpl::ReserveCapacity(
    unsigned int subd_fragment_count,
    unsigned int absolute_subd_display_density)
{
  ClearTree();

  m_absolute_subd_display_density = 0;
  m_fragment_count = 0;
  m_fragment_point_count = 0;
  m_first_fragment = nullptr;

  if (absolute_subd_display_density > ON_SubDDisplayParameters::MaximumDensity)
    return ON_SUBD_RETURN_ERROR(false);

  unsigned int fragment_point_count = ON_SubDMeshFragment::PointCountFromDisplayDensity(absolute_subd_display_density);
  if ( subd_fragment_count < 1 )
    return ON_SUBD_RETURN_ERROR(false);

  size_t sizeof_PNTKC = fragment_point_count * ON_SubDMeshFragment::DoublesPerVertex * sizeof(double);
  size_t sizeof_fragment = sizeof(ON_SubDMeshFragment);
  if (0 != sizeof_fragment % sizeof(double))
  {
    sizeof_fragment = (1 + sizeof_fragment / sizeof(double))*sizeof(double);
  }

  if( false == m_fsp.Create(sizeof_fragment + sizeof_PNTKC, subd_fragment_count, 0))
    return ON_SUBD_RETURN_ERROR(false);

  m_absolute_subd_display_density = absolute_subd_display_density;
  m_fragment_point_count = fragment_point_count;

  return true;
}